

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

qsizetype QtPrivate::indexOf<QDateTimeParser::SectionNode,QDateTimeParser::SectionNode>
                    (QList<QDateTimeParser::SectionNode> *vector,SectionNode *u,qsizetype from)

{
  bool bVar1;
  qsizetype qVar2;
  longlong *plVar3;
  const_iterator cVar4;
  const_iterator *this;
  SectionNode *pSVar5;
  ulong uVar6;
  long in_RDX;
  SectionNode *in_RSI;
  QList<QDateTimeParser::SectionNode> *in_RDI;
  long in_FS_OFFSET;
  const_iterator e;
  const_iterator n;
  qsizetype in_stack_ffffffffffffff58;
  QList<QDateTimeParser::SectionNode> *in_stack_ffffffffffffff60;
  long local_80;
  qsizetype local_68;
  const_iterator local_20;
  longlong local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_80 = in_RDX;
  if (in_RDX < 0) {
    qVar2 = QList<QDateTimeParser::SectionNode>::size(in_RDI);
    local_10 = in_RDX + qVar2;
    local_18 = 0;
    plVar3 = qMax<long_long>(&local_10,&local_18);
    local_80 = *plVar3;
  }
  qVar2 = QList<QDateTimeParser::SectionNode>::size(in_RDI);
  if (local_80 < qVar2) {
    local_20.i = (SectionNode *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QDateTimeParser::SectionNode>::begin(in_stack_ffffffffffffff60);
    QList<QDateTimeParser::SectionNode>::const_iterator::operator+
              ((const_iterator *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_20 = QList<QDateTimeParser::SectionNode>::const_iterator::operator-
                         ((const_iterator *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    cVar4 = QList<QDateTimeParser::SectionNode>::end(in_stack_ffffffffffffff60);
    do {
      this = QList<QDateTimeParser::SectionNode>::const_iterator::operator++(&local_20);
      bVar1 = QList<QDateTimeParser::SectionNode>::const_iterator::operator!=(this,cVar4);
      if (!bVar1) goto LAB_0056a441;
      pSVar5 = QList<QDateTimeParser::SectionNode>::const_iterator::operator*(&local_20);
      uVar6 = ::operator==(*pSVar5,*in_RSI);
    } while ((uVar6 & 1) == 0);
    cVar4 = QList<QDateTimeParser::SectionNode>::begin(in_stack_ffffffffffffff60);
    local_68 = QList<QDateTimeParser::SectionNode>::const_iterator::operator-(&local_20,cVar4);
  }
  else {
LAB_0056a441:
    local_68 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_68;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}